

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O2

string * __thiscall
gl3cts::ClipDistance::FunctionalTest::prepareVertexShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,FunctionalTest *this,bool explicit_redeclaration,
          bool dynamic_setter,GLuint clip_count,GLuint clip_function,GLenum primitive_type)

{
  GLint i;
  GLint i_00;
  undefined7 in_register_00000011;
  string *psVar1;
  uint uVar2;
  string static_setters;
  string i_setter;
  allocator<char> local_45d;
  GLuint local_45c;
  string local_458;
  uint local_434;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_45c = clip_count;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,m_vertex_shader_code,(allocator<char> *)&local_458);
  if ((int)CONCAT71(in_register_00000011,explicit_redeclaration) == 0) {
    std::__cxx11::string::string((string *)&local_110,(string *)__return_storage_ptr__);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"CLIP_DISTANCE_REDECLARATION",(allocator<char> *)&local_430);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&local_410);
    Utility::preprocessCode(&local_458,&local_110,&local_130,&local_150);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_458);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_130);
    psVar1 = &local_110;
  }
  else {
    std::__cxx11::string::string((string *)&local_b0,(string *)__return_storage_ptr__);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"CLIP_DISTANCE_REDECLARATION",(allocator<char> *)&local_430);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,m_explicit_redeclaration,(allocator<char> *)&local_410);
    Utility::preprocessCode(&local_458,&local_b0,&local_d0,&local_f0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_458);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    psVar1 = &local_b0;
  }
  std::__cxx11::string::~string((string *)psVar1);
  if (dynamic_setter) {
    std::__cxx11::string::string((string *)&local_170,(string *)__return_storage_ptr__);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"CLIP_DISTANCE_SETUP",(allocator<char> *)&local_430);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,m_dynamic_array_setter,(allocator<char> *)&local_410);
    Utility::preprocessCode(&local_458,&local_170,&local_190,&local_1b0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_458);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_190);
    psVar1 = &local_170;
  }
  else {
    local_434 = clip_function;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_458,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&local_430);
    for (uVar2 = 0; local_45c != uVar2; uVar2 = uVar2 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_430,m_static_array_setter,(allocator<char> *)&local_410);
      std::__cxx11::string::string((string *)&local_50,(string *)&local_430);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"CLIP_INDEX",&local_45d);
      Utility::itoa_abi_cxx11_(&local_90,(Utility *)(ulong)uVar2,i);
      Utility::preprocessCode(&local_410,&local_50,&local_70,&local_90);
      std::__cxx11::string::operator=((string *)&local_430,(string *)&local_410);
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::append((string *)&local_458);
      std::__cxx11::string::~string((string *)&local_430);
    }
    std::__cxx11::string::string((string *)&local_1d0,(string *)__return_storage_ptr__);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,"CLIP_DISTANCE_SETUP",(allocator<char> *)&local_410);
    clip_function = local_434;
    std::__cxx11::string::string((string *)&local_210,(string *)&local_458);
    Utility::preprocessCode(&local_430,&local_1d0,&local_1f0,&local_210);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_430);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1d0);
    psVar1 = &local_458;
  }
  std::__cxx11::string::~string((string *)psVar1);
  std::__cxx11::string::string((string *)&local_230,(string *)__return_storage_ptr__);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"CLIP_FUNCTION",(allocator<char> *)&local_430);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,m_clip_function[clip_function],(allocator<char> *)&local_410);
  Utility::preprocessCode(&local_458,&local_230,&local_250,&local_270);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_458);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_290,(string *)__return_storage_ptr__);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"CLIP_COUNT",(allocator<char> *)&local_430);
  Utility::itoa_abi_cxx11_(&local_2d0,(Utility *)(ulong)local_45c,i_00);
  Utility::preprocessCode(&local_458,&local_290,&local_2b0,&local_2d0);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_458);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  if (primitive_type == 0) {
    std::__cxx11::string::string((string *)&local_2f0,(string *)__return_storage_ptr__);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,"VERTEX_COUNT",(allocator<char> *)&local_430);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_330,"1",(allocator<char> *)&local_410);
    Utility::preprocessCode(&local_458,&local_2f0,&local_310,&local_330);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_458);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_310);
    psVar1 = &local_2f0;
  }
  else if (primitive_type == 1) {
    std::__cxx11::string::string((string *)&local_350,(string *)__return_storage_ptr__);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,"VERTEX_COUNT",(allocator<char> *)&local_430);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_390,"2",(allocator<char> *)&local_410);
    Utility::preprocessCode(&local_458,&local_350,&local_370,&local_390);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_458);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_370);
    psVar1 = &local_350;
  }
  else {
    if (primitive_type != 4) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&local_3b0,(string *)__return_storage_ptr__);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d0,"VERTEX_COUNT",(allocator<char> *)&local_430);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f0,"3",(allocator<char> *)&local_410);
    Utility::preprocessCode(&local_458,&local_3b0,&local_3d0,&local_3f0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_458);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_3d0);
    psVar1 = &local_3b0;
  }
  std::__cxx11::string::~string((string *)psVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string gl3cts::ClipDistance::FunctionalTest::prepareVertexShaderCode(bool explicit_redeclaration,
																		  bool dynamic_setter, glw::GLuint clip_count,
																		  glw::GLuint clip_function,
																		  glw::GLenum primitive_type)
{
	std::string vertex_shader = m_vertex_shader_code;

	if (explicit_redeclaration)
	{
		vertex_shader = gl3cts::ClipDistance::Utility::preprocessCode(vertex_shader, "CLIP_DISTANCE_REDECLARATION",
																	  m_explicit_redeclaration);
	}
	else
	{
		vertex_shader = gl3cts::ClipDistance::Utility::preprocessCode(vertex_shader, "CLIP_DISTANCE_REDECLARATION", "");
	}

	if (dynamic_setter)
	{
		vertex_shader =
			gl3cts::ClipDistance::Utility::preprocessCode(vertex_shader, "CLIP_DISTANCE_SETUP", m_dynamic_array_setter);
	}
	else
	{
		std::string static_setters = "";

		for (glw::GLuint i = 0; i < clip_count; ++i)
		{
			std::string i_setter = m_static_array_setter;

			i_setter = gl3cts::ClipDistance::Utility::preprocessCode(i_setter, "CLIP_INDEX",
																	 gl3cts::ClipDistance::Utility::itoa(i));

			static_setters.append(i_setter);
		}

		vertex_shader =
			gl3cts::ClipDistance::Utility::preprocessCode(vertex_shader, "CLIP_DISTANCE_SETUP", static_setters);
	}

	vertex_shader =
		gl3cts::ClipDistance::Utility::preprocessCode(vertex_shader, "CLIP_FUNCTION", m_clip_function[clip_function]);

	vertex_shader = gl3cts::ClipDistance::Utility::preprocessCode(vertex_shader, "CLIP_COUNT",
																  gl3cts::ClipDistance::Utility::itoa(clip_count));

	switch (primitive_type)
	{
	case GL_POINTS:
		vertex_shader = gl3cts::ClipDistance::Utility::preprocessCode(vertex_shader, "VERTEX_COUNT", "1");
		break;
	case GL_LINES:
		vertex_shader = gl3cts::ClipDistance::Utility::preprocessCode(vertex_shader, "VERTEX_COUNT", "2");
		break;
	case GL_TRIANGLES:
		vertex_shader = gl3cts::ClipDistance::Utility::preprocessCode(vertex_shader, "VERTEX_COUNT", "3");
		break;
	}

	return vertex_shader;
}